

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cpp
# Opt level: O3

uint64_t top64(uint64_t x,uint64_t y)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (x >> 0x20) * (y & 0xffffffff);
  uVar1 = (y >> 0x20) * (x & 0xffffffff);
  return ((uVar2 & 0xffffffff) +
          (uVar1 & 0xffffffff) + ((y & 0xffffffff) * (x & 0xffffffff) >> 0x20) >> 0x20) +
         (uVar2 >> 0x20) + (uVar1 >> 0x20) + (y >> 0x20) * (x >> 0x20);
}

Assistant:

uint64_t top64(uint64_t x, uint64_t y) {
    uint64_t a = x >> 32, b = x & 0xffffffff;
    uint64_t c = y >> 32, d = y & 0xffffffff;

    uint64_t ac = a * c;
    uint64_t bc = b * c;
    uint64_t ad = a * d;
    uint64_t bd = b * d;

    uint64_t mid34 = (bd >> 32) + (bc & 0xffffffff) + (ad & 0xffffffff);

    uint64_t upper64 = ac + (bc >> 32) + (ad >> 32) + (mid34 >> 32);
//  uint64_t lower64 = (mid34 << 32) | (bd & 0xffffffff);

    return upper64;
}